

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&),_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
* __thiscall
boost::unordered::
unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&),_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
::operator=(unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&),_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
            *this,initializer_list<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>
                  il)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  value_type_pointer ppVar3;
  ulong uVar4;
  int iVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  byte bVar9;
  bool bVar10;
  byte bVar11;
  uint uVar12;
  uint64_t hash;
  long lVar13;
  ulong uVar14;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>
  *ppVar15;
  ulong pos0;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>
  *args;
  ulong uVar16;
  undefined1 auVar17 [16];
  locator local_48;
  
  args = il._M_array;
  detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
  ::clear((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
           *)this);
  ppVar15 = args + il._M_len;
  do {
    if (args == ppVar15) {
      return this;
    }
    hash = slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)this,
                      &args->first);
    pos0 = hash >> ((byte)(this->table_).
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
                          .arrays.groups_size_index & 0x3f);
    lVar13 = (hash & 0xff) * 4;
    uVar6 = (&UNK_0040c7ac)[lVar13];
    uVar7 = (&UNK_0040c7ad)[lVar13];
    uVar8 = (&UNK_0040c7ae)[lVar13];
    bVar9 = (&UNK_0040c7af)[lVar13];
    uVar16 = 0;
    uVar14 = pos0;
    do {
      pgVar2 = (this->table_).
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
               .arrays.groups_;
      pgVar1 = pgVar2 + uVar14;
      bVar11 = pgVar1->m[0xf].n;
      auVar17[0] = -(pgVar1->m[0].n == uVar6);
      auVar17[1] = -(pgVar1->m[1].n == uVar7);
      auVar17[2] = -(pgVar1->m[2].n == uVar8);
      auVar17[3] = -(pgVar1->m[3].n == bVar9);
      auVar17[4] = -(pgVar1->m[4].n == uVar6);
      auVar17[5] = -(pgVar1->m[5].n == uVar7);
      auVar17[6] = -(pgVar1->m[6].n == uVar8);
      auVar17[7] = -(pgVar1->m[7].n == bVar9);
      auVar17[8] = -(pgVar1->m[8].n == uVar6);
      auVar17[9] = -(pgVar1->m[9].n == uVar7);
      auVar17[10] = -(pgVar1->m[10].n == uVar8);
      auVar17[0xb] = -(pgVar1->m[0xb].n == bVar9);
      auVar17[0xc] = -(pgVar1->m[0xc].n == uVar6);
      auVar17[0xd] = -(pgVar1->m[0xd].n == uVar7);
      auVar17[0xe] = -(pgVar1->m[0xe].n == uVar8);
      auVar17[0xf] = -(bVar11 == bVar9);
      uVar12 = (uint)(ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe);
      if (uVar12 != 0) {
        ppVar3 = (this->table_).
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
                 .arrays.elements_;
        do {
          iVar5 = 0;
          if (uVar12 != 0) {
            for (; (uVar12 >> iVar5 & 1) == 0; iVar5 = iVar5 + 1) {
            }
          }
          bVar10 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                             ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                              this,&args->first,
                              (basic_string_view<char,_std::char_traits<char>_> *)
                              ((long)&ppVar3[uVar14 * 0xf].first._M_len + (ulong)(uint)(iVar5 << 5))
                             );
          if (bVar10) goto LAB_001a3a66;
          uVar12 = uVar12 - 1 & uVar12;
        } while (uVar12 != 0);
        bVar11 = pgVar2[uVar14].m[0xf].n;
      }
      if (((&detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bVar11) == 0) break;
      uVar4 = (this->table_).
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
              .arrays.groups_size_mask;
      lVar13 = uVar14 + uVar16;
      uVar16 = uVar16 + 1;
      uVar14 = lVar13 + 1U & uVar4;
    } while (uVar16 <= uVar4);
    if ((this->table_).
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
        .size_ctrl.size <
        (this->table_).
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
        .size_ctrl.ml) {
      detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>>>
      ::
      unchecked_emplace_at<std::pair<std::basic_string_view<char,std::char_traits<char>>const,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>const&>
                (&local_48,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>>>
                  *)this,pos0,hash,args);
    }
    else {
      detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>>>
      ::
      unchecked_emplace_with_rehash<std::pair<std::basic_string_view<char,std::char_traits<char>>const,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>const&>
                (&local_48,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,void(slang::parsing::Preprocessor::*)(slang::parsing::Token,slang::syntax::PragmaExpressionSyntax_const*,slang::SmallVectorBase<slang::parsing::Token>&)>>>
                  *)this,hash,args);
    }
LAB_001a3a66:
    args = args + 1;
  } while( true );
}

Assistant:

unordered_flat_map& operator=(std::initializer_list<value_type> il) {
        this->clear();
        this->insert(il.begin(), il.end());
        return *this;
    }